

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_bitmap(tgestate_t *state,uint8_t *src,uint8_t *dst,uint8_t width,uint8_t height)

{
  uint8_t *puVar1;
  uint8_t *__dest;
  ushort uVar2;
  short sVar3;
  undefined7 in_register_00000009;
  uint uVar5;
  uint8_t uVar6;
  ulong __n;
  ulong uVar4;
  
  __n = CONCAT71(in_register_00000009,width) & 0xffffffff;
  __dest = dst;
  uVar6 = height;
  do {
    memcpy(__dest,src,__n);
    puVar1 = (state->speccy->screen).pixels;
    uVar5 = (int)__dest - (int)puVar1;
    uVar2 = (ushort)(uVar5 + 0x100);
    if ((uVar5 + 0x100 & 0x700) == 0) {
      sVar3 = (short)uVar5 + 0x20;
      if ((~uVar5 & 0xe0) != 0) {
        sVar3 = uVar2 - 0x7e0;
      }
      uVar4 = (ulong)sVar3;
    }
    else {
      uVar4 = (ulong)uVar2;
    }
    src = src + __n;
    __dest = puVar1 + uVar4;
    uVar6 = uVar6 + 0xff;
  } while (uVar6 != '\0');
  invalidate_bitmap(state,dst,(uint)width << 3,(uint)height);
  return;
}

Assistant:

void plot_bitmap(tgestate_t    *state,
                 const uint8_t *src,
                 uint8_t       *dst,
                 uint8_t        width,
                 uint8_t        height)
{
  uint8_t  h;
  uint8_t *curr_dst;

  assert(state != NULL);
  assert(src   != NULL);
  assert(dst   != NULL);
  assert(width  > 0);
  assert(height > 0);

  h        = height;
  curr_dst = dst;
  do
  {
    memcpy(curr_dst, src, width);
    src += width;
    curr_dst = get_next_scanline(state, curr_dst);
  }
  while (--h);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, dst, width * 8, height);
}